

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Voice::render(V2Voice *this,StereoSample *dest,int nsamples)

{
  float *dest_00;
  float fVar1;
  V2Instance *pVVar2;
  ulong uVar3;
  long lVar4;
  V2Flt *this_00;
  float fVar5;
  float fVar6;
  float fVar7;
  
  if (0x118 < nsamples) {
    __assert_fail("nsamples <= V2Instance::MAX_FRAME_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                  ,0x687,"void V2Voice::render(StereoSample *, int)");
  }
  pVVar2 = this->inst;
  dest_00 = pVVar2->vcebuf;
  memset(dest_00,0,(long)nsamples << 2);
  lVar4 = 0x30;
  do {
    V2Osc::render((V2Osc *)((long)this->osc + lVar4 + -0x30),dest_00,nsamples);
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0xf0);
  this_00 = this->vcf;
  if (this->fmode != 0) {
    if (this->fmode == 2) {
      V2Flt::render(this->vcf + 1,pVVar2->vcebuf2,dest_00,nsamples,1);
      V2Flt::render(this_00,dest_00,dest_00,nsamples,1);
      if (0 < nsamples) {
        uVar3 = 0;
        do {
          dest_00[uVar3] = dest_00[uVar3] * this->f1gain + pVVar2->vcebuf2[uVar3] * this->f2gain;
          uVar3 = uVar3 + 1;
        } while ((uint)nsamples != uVar3);
      }
      goto LAB_00109d2e;
    }
    V2Flt::render(this_00,dest_00,dest_00,nsamples,1);
    this_00 = this->vcf + 1;
  }
  V2Flt::render(this_00,dest_00,dest_00,nsamples,1);
LAB_00109d2e:
  V2Dist::renderMono(&this->dist,dest_00,dest_00,nsamples);
  fVar6 = (this->dcf).fl.xm1;
  fVar5 = (this->dcf).fl.ym1;
  if (0 < nsamples) {
    fVar1 = ((this->dcf).inst)->SRfcdcfilter;
    uVar3 = 0;
    fVar7 = fVar6;
    do {
      fVar6 = dest_00[uVar3];
      fVar5 = ((fVar5 * fVar1 + 3.8146973e-06) - fVar7) + fVar6 + -3.8146973e-06;
      dest_00[uVar3] = fVar5;
      uVar3 = uVar3 + 1;
      fVar7 = fVar6;
    } while ((uint)nsamples != uVar3);
  }
  (this->dcf).fl.xm1 = fVar6;
  (this->dcf).fl.ym1 = fVar5;
  fVar6 = this->curvol;
  if (0 < nsamples) {
    uVar3 = 0;
    do {
      fVar5 = dest_00[uVar3] * fVar6;
      fVar6 = fVar6 + this->volramp;
      dest[uVar3].field_0.l = this->lvol * fVar5 + 3.8146973e-06 + dest[uVar3].field_0.l;
      *(float *)((long)dest + uVar3 * 8 + 4) =
           fVar5 * this->rvol + 3.8146973e-06 + *(float *)((long)dest + uVar3 * 8 + 4);
      uVar3 = uVar3 + 1;
    } while ((uint)nsamples != uVar3);
  }
  this->curvol = fVar6;
  return;
}

Assistant:

void render(StereoSample *dest, int nsamples)
    {
        assert(nsamples <= V2Instance::MAX_FRAME_SIZE);

        // clear voice buffer
        float *voice = inst->vcebuf;
        float *voice2 = inst->vcebuf2;
        memset(voice, 0, nsamples * sizeof(*voice));

        // oscillators -> voice buffer
        for (int i=0; i < syVV2::NOSC; i++)
            osc[i].render(voice, nsamples);

        // voice buffer -> filters -> voice buffer
        switch (fmode)
        {
        case FLTR_SINGLE:
            COVER("VOICE filter single");
            vcf[0].render(voice, voice, nsamples);
            break;

        case FLTR_SERIAL:
        default:
            COVER("VOICE filter serial");
            vcf[0].render(voice, voice, nsamples);
            vcf[1].render(voice, voice, nsamples);
            break;

        case FLTR_PARALLEL:
            COVER("VOICE filter parallel");
            vcf[1].render(voice2, voice, nsamples);
            vcf[0].render(voice, voice, nsamples);
            for (int i=0; i < nsamples; i++)
                voice[i] = voice[i]*f1gain + voice2[i]*f2gain;
            break;
        }

        // voice buffer -> distortion -> voice buffer
        dist.renderMono(voice, voice, nsamples);

        // voice buffer -> dc filter -> voice buffer
        dcf.renderMono(voice, voice, nsamples);

        DEBUG_PLOT(this, voice, nsamples);

        // voice buffer (mono) -> +=output buffer (stereo)
        // original ASM code has chan buffer hardwired as output here
        float cv = curvol;
        for (int i=0; i < nsamples; i++)
        {
            float out = voice[i] * cv;
            cv += volramp;

            dest[i].l += lvol * out + fcdcoffset;
            dest[i].r += rvol * out + fcdcoffset;
        }

        curvol = cv;
    }